

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzReadHeader2(CSzArEx *p,CSzData *sd,ILookInStream *inStream,CBuf *tempBufs,UInt32 *numTempBufs
                  ,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  CSzData *pCVar1;
  SRes SVar2;
  uint uVar3;
  size_t sVar4;
  Byte *pBVar5;
  int __result___24;
  UInt32 byteIndex_1;
  int __result___23;
  UInt64 v;
  UInt64 startFolderUnpackPos;
  UInt64 folderUnpackSize_1;
  UInt64 folderUnpackSize;
  int __result___22;
  UInt32 byteIndex;
  size_t numBytes;
  int __result___21;
  Byte mask;
  Byte crcMask;
  Byte isDirMask;
  Byte allDigestsDefined;
  UInt32 digestIndex;
  UInt32 digestsValsIndex;
  Byte *digestsVals;
  Byte *digestsDefs;
  UInt64 unpackPos;
  int local_1b8;
  UInt32 numSubStreams;
  UInt32 remSubStreams;
  UInt32 folderIndex;
  UInt32 emptyFileIndex;
  UInt32 i;
  int __result___20;
  int __result___19;
  UInt64 type_2;
  int __result___18;
  int __result___17;
  int __result___16;
  int __result___15;
  UInt32 index_1;
  int __result___14;
  CSzData *sdPtr;
  CSzData sdSwitch;
  Byte external_1;
  int __result___13;
  int __result___12;
  int __result___11;
  int __result___10;
  UInt32 index;
  Byte external;
  Byte *namesData;
  size_t namesSize;
  int __result___9;
  int __result___8;
  UInt64 size;
  UInt64 type_1;
  Byte *pBStack_118;
  int __result___7;
  Byte *emptyFiles;
  Byte *emptyStreams;
  UInt32 numEmptyStreams;
  UInt32 numFiles;
  int __result___6;
  int __result___5;
  int __result___4;
  SRes res;
  CSzAr tempAr;
  int __result___3;
  int __result___2;
  int __result___1;
  UInt64 type2;
  UInt64 UStack_80;
  int __result__;
  UInt64 type;
  CSubStreamInfo ssi;
  ISzAlloc *allocMain_local;
  UInt32 *numTempBufs_local;
  CBuf *tempBufs_local;
  ILookInStream *inStream_local;
  CSzData *sd_local;
  CSzArEx *p_local;
  
  ssi.sdNumSubStreams.Size = 0;
  ssi.sdSizes.Data = (Byte *)0x0;
  ssi.sdSizes.Size = 0;
  ssi.sdCRCs.Data = (Byte *)0x0;
  ssi.NumTotalSubStreams = 0;
  ssi.NumSubDigests = 0;
  ssi.sdNumSubStreams.Data = (Byte *)0x0;
  type._4_4_ = 0;
  type._0_4_ = 0;
  ssi.sdCRCs.Size = (size_t)allocMain;
  SVar2 = ReadNumber(sd,&stack0xffffffffffffff80);
  if (SVar2 != 0) {
    return SVar2;
  }
  type2._4_4_ = 0;
  if (UStack_80 == 2) {
    while( true ) {
      SVar2 = ReadNumber(sd,(UInt64 *)&__result___2);
      if (SVar2 != 0) {
        return SVar2;
      }
      if (___result___2 == 0) break;
      SVar2 = SkipData(sd);
      if (SVar2 != 0) {
        return SVar2;
      }
    }
    SVar2 = ReadNumber(sd,&stack0xffffffffffffff80);
    if (SVar2 != 0) {
      return SVar2;
    }
    tempAr.CodersData._4_4_ = 0;
  }
  if (UStack_80 == 3) {
    SzAr_Init((CSzAr *)&__result___4);
    __result___5 = SzReadAndDecodePackedStreams
                             (inStream,sd,tempBufs,8,p->startPosAfterHeader,(CSzAr *)&__result___4,
                              allocTemp);
    *numTempBufs = res;
    SzAr_Free((CSzAr *)&__result___4,allocTemp);
    if (__result___5 != 0) {
      return __result___5;
    }
    SVar2 = ReadNumber(sd,&stack0xffffffffffffff80);
    if (SVar2 != 0) {
      return SVar2;
    }
    __result___6 = 0;
  }
  if (UStack_80 == 4) {
    numFiles = SzReadStreamsInfo(&p->db,sd,0x40000000,tempBufs,*numTempBufs,&p->dataPos,
                                 (CSubStreamInfo *)&type,(ISzAlloc *)ssi.sdCRCs.Size);
    if (numFiles != 0) {
      return numFiles;
    }
    p->dataPos = p->startPosAfterHeader + p->dataPos;
    SVar2 = ReadNumber(sd,&stack0xffffffffffffff80);
    if (SVar2 != 0) {
      return SVar2;
    }
    numEmptyStreams = 0;
  }
  if (UStack_80 == 0) {
    return 0;
  }
  if (UStack_80 != 5) {
    return 0x10;
  }
  emptyStreams._4_4_ = 0;
  emptyStreams._0_4_ = 0;
  emptyFiles = (Byte *)0x0;
  pBStack_118 = (Byte *)0x0;
  SVar2 = SzReadNumber32(sd,(UInt32 *)((long)&emptyStreams + 4));
  if (SVar2 != 0) {
    return SVar2;
  }
  p->NumFiles = emptyStreams._4_4_;
  type_1._4_4_ = 0;
  sd_local = (CSzData *)p;
  while( true ) {
    namesSize._4_4_ = ReadNumber(sd,&size);
    if (namesSize._4_4_ != 0) {
      return namesSize._4_4_;
    }
    if (CONCAT44(size._4_4_,(undefined4)size) == 0) break;
    namesSize._0_4_ = ReadNumber(sd,(UInt64 *)&__result___9);
    if ((SRes)namesSize != 0) {
      return (SRes)namesSize;
    }
    if (sd->Size < ___result___9) {
      return 0x10;
    }
    if (CONCAT44(size._4_4_,(undefined4)size) < 0x100) {
      switch((undefined4)size) {
      case 0xe:
        SVar2 = RememberBitVector(sd,emptyStreams._4_4_,&emptyFiles);
        if (SVar2 != 0) {
          return SVar2;
        }
        emptyStreams._0_4_ = CountDefinedBits(emptyFiles,emptyStreams._4_4_);
        pBStack_118 = (Byte *)0x0;
        break;
      case 0xf:
        SVar2 = RememberBitVector(sd,(UInt32)emptyStreams,&stack0xfffffffffffffee8);
        if (SVar2 != 0) {
          return SVar2;
        }
        break;
      default:
        sd->Size = sd->Size - ___result___9;
        sd->Data = sd->Data + ___result___9;
        break;
      case 0x11:
        if (sd->Size == 0) {
          return 0x10;
        }
        sd->Size = sd->Size - 1;
        pBVar5 = sd->Data;
        sd->Data = pBVar5 + 1;
        __result___10._3_1_ = *pBVar5;
        if (__result___10._3_1_ == '\0') {
          namesData = (Byte *)(___result___9 - 1);
          _index = sd->Data;
        }
        else {
          SVar2 = SzReadNumber32(sd,(UInt32 *)&__result___11);
          if (SVar2 != 0) {
            return SVar2;
          }
          if (*numTempBufs <= (uint)__result___11) {
            return 0x10;
          }
          _index = tempBufs[(uint)__result___11].data;
          namesData = (Byte *)tempBufs[(uint)__result___11].size;
        }
        if (((ulong)namesData & 1) != 0) {
          return 0x10;
        }
        sVar4 = (**(code **)ssi.sdCRCs.Size)(ssi.sdCRCs.Size,(ulong)(emptyStreams._4_4_ + 1) << 3);
        sd_local[0xc].Size = sVar4;
        if (sVar4 == 0) {
          return 2;
        }
        if (namesData == (Byte *)0x0) {
          sd_local = (CSzData *)0x0;
        }
        else {
          pBVar5 = (Byte *)(**(code **)ssi.sdCRCs.Size)(ssi.sdCRCs.Size,namesData);
          sd_local[0xd].Data = pBVar5;
          if (pBVar5 == (Byte *)0x0) {
            return 2;
          }
          memcpy(sd_local[0xd].Data,_index,(size_t)namesData);
        }
        SVar2 = SzReadFileNames(sd_local[0xd].Data,(size_t)namesData,emptyStreams._4_4_,
                                (size_t *)sd_local[0xc].Size);
        if (SVar2 != 0) {
          return SVar2;
        }
        if (__result___10._3_1_ == '\0') {
          sd->Size = sd->Size - (long)namesData;
          sd->Data = namesData + (long)sd->Data;
        }
        break;
      case 0x12:
        SVar2 = ReadTime((CSzBitUi64s *)&sd_local[10].Size,emptyStreams._4_4_,sd,tempBufs,
                         *numTempBufs,(ISzAlloc *)ssi.sdCRCs.Size);
        if (SVar2 != 0) {
          return SVar2;
        }
        type_2._0_4_ = 0;
        break;
      case 0x14:
        SVar2 = ReadTime((CSzBitUi64s *)&sd_local[9].Size,emptyStreams._4_4_,sd,tempBufs,
                         *numTempBufs,(ISzAlloc *)ssi.sdCRCs.Size);
        if (SVar2 != 0) {
          return SVar2;
        }
        type_2._4_4_ = 0;
        break;
      case 0x15:
        SzBitUi32s_Free((CSzBitUi32s *)&sd_local[8].Size,(ISzAlloc *)ssi.sdCRCs.Size);
        __result___15 =
             ReadBitVector(sd,emptyStreams._4_4_,(Byte **)&sd_local[8].Size,
                           (ISzAlloc *)ssi.sdCRCs.Size);
        if (__result___15 != 0) {
          return __result___15;
        }
        if (sd->Size == 0) {
          return 0x10;
        }
        sd->Size = sd->Size - 1;
        pBVar5 = sd->Data;
        sd->Data = pBVar5 + 1;
        sdSwitch.Size._7_1_ = *pBVar5;
        pCVar1 = sd;
        if (sdSwitch.Size._7_1_ != '\0') {
          SVar2 = SzReadNumber32(sd,(UInt32 *)&__result___16);
          if (SVar2 != 0) {
            return SVar2;
          }
          if (*numTempBufs <= (uint)__result___16) {
            return 0x10;
          }
          sdPtr = (CSzData *)tempBufs[(uint)__result___16].data;
          sdSwitch.Data = (Byte *)tempBufs[(uint)__result___16].size;
          __result___17 = 0;
          pCVar1 = (CSzData *)&sdPtr;
        }
        _index_1 = pCVar1;
        SVar2 = ReadUi32s(_index_1,emptyStreams._4_4_,(CSzBitUi32s *)&sd_local[8].Size,
                          (ISzAlloc *)ssi.sdCRCs.Size);
        if (SVar2 != 0) {
          return SVar2;
        }
        __result___18 = 0;
      }
    }
    else {
      sd->Size = sd->Size - ___result___9;
      sd->Data = sd->Data + ___result___9;
    }
  }
  if (emptyStreams._4_4_ - (UInt32)emptyStreams != (int)type) {
    return 0x10;
  }
  namesSize._4_4_ = 0;
  while( true ) {
    i = ReadNumber(sd,(UInt64 *)&__result___20);
    if (i != 0) {
      return i;
    }
    if (___result___20 == 0) break;
    SVar2 = SkipData(sd);
    if (SVar2 != 0) {
      return SVar2;
    }
    emptyFileIndex = 0;
  }
  remSubStreams = 0;
  numSubStreams = 0;
  local_1b8 = 0;
  unpackPos._4_4_ = 0;
  digestsDefs = (Byte *)0x0;
  digestsVals = (Byte *)0x0;
  _digestIndex = (Byte *)0x0;
  _mask = 0;
  numBytes._7_1_ = '\0';
  numBytes._6_1_ = 0;
  numBytes._5_1_ = 0;
  numBytes._4_1_ = 0x80;
  sVar4 = (**(code **)ssi.sdCRCs.Size)
                    (ssi.sdCRCs.Size,(ulong)(*(int *)((long)&sd_local->Data + 4) + 1) << 2);
  sd_local[0xb].Size = sVar4;
  if (sVar4 == 0) {
    return 2;
  }
  if (*(int *)&sd_local[6].Data == 0) {
    sd_local[0xc].Data = (Byte *)0x0;
  }
  else {
    pBVar5 = (Byte *)(**(code **)ssi.sdCRCs.Size)
                               (ssi.sdCRCs.Size,(ulong)*(uint *)&sd_local[6].Data << 2);
    sd_local[0xc].Data = pBVar5;
    if (pBVar5 == (Byte *)0x0) {
      return 2;
    }
  }
  sVar4 = (**(code **)ssi.sdCRCs.Size)(ssi.sdCRCs.Size,(ulong)(*(int *)&sd_local[6].Data + 1) << 3);
  sd_local[6].Size = sVar4;
  if (sVar4 == 0) {
    return 2;
  }
  if (*(int *)&sd_local[6].Data + 7U >> 3 == 0) {
    sd_local[7].Data = (Byte *)0x0;
  }
  else {
    pBVar5 = (Byte *)(**(code **)ssi.sdCRCs.Size)
                               (ssi.sdCRCs.Size,*(int *)&sd_local[6].Data + 7U >> 3);
    sd_local[7].Data = pBVar5;
    if (pBVar5 == (Byte *)0x0) {
      return 2;
    }
  }
  SVar2 = SzBitUi32s_Alloc((CSzBitUi32s *)&sd_local[7].Size,(ulong)*(uint *)&sd_local[6].Data,
                           (ISzAlloc *)ssi.sdCRCs.Size);
  if (SVar2 != 0) {
    return SVar2;
  }
  if (ssi.sdCRCs.Data != (Byte *)0x0) {
    if (ssi.sdCRCs.Data == (Byte *)0x0) {
      return 0x10;
    }
    ssi.sdCRCs.Data = ssi.sdCRCs.Data + -1;
    pBVar5 = (Byte *)(ssi.sdSizes.Size + 1);
    numBytes._7_1_ = *(char *)ssi.sdSizes.Size;
    _digestIndex = pBVar5;
    ssi.sdSizes.Size = (size_t)pBVar5;
    if (numBytes._7_1_ == '\0') {
      ___result___22 = (ulong)(type._4_4_ + 7U >> 3);
      _digestIndex = pBVar5 + ___result___22;
      digestsVals = pBVar5;
    }
  }
  __result___21 = 0;
  folderIndex = 0;
  numBytes._0_4_ = 0;
  do {
    if (emptyStreams._4_4_ <= folderIndex) {
      if (numBytes._4_1_ != 0x80) {
        uVar3 = folderIndex - 1 >> 3;
        sd_local[7].Data[uVar3] = numBytes._6_1_;
        *(byte *)(sd_local[7].Size + (ulong)uVar3) = numBytes._5_1_;
      }
      *(Byte **)(sd_local[6].Size + (ulong)folderIndex * 8) = digestsDefs;
      if (local_1b8 == 0) {
        for (; *(UInt32 *)(sd_local[0xb].Size + (ulong)numSubStreams * 4) = folderIndex,
            numSubStreams < *(uint *)((long)&sd_local->Data + 4); numSubStreams = numSubStreams + 1)
        {
          if (ssi._0_8_ == 0) {
            return 0x10;
          }
          SVar2 = SzReadNumber32((CSzData *)&ssi,(UInt32 *)((long)&unpackPos + 4));
          if (SVar2 != 0) {
            return SVar2;
          }
          if (unpackPos._4_4_ != 0) {
            return 0x10;
          }
        }
        if ((ssi._0_8_ == 0) || (ssi.sdNumSubStreams.Data == (Byte *)0x0)) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 0x10;
        }
      }
      else {
        p_local._4_4_ = 0x10;
      }
      return p_local._4_4_;
    }
    if (numBytes._4_1_ == 0) {
      folderUnpackSize._4_4_ = folderIndex - 1 >> 3;
      sd_local[7].Data[folderUnpackSize._4_4_] = numBytes._6_1_;
      *(byte *)(sd_local[7].Size + (ulong)folderUnpackSize._4_4_) = numBytes._5_1_;
      numBytes._6_1_ = 0;
      numBytes._5_1_ = 0;
      numBytes._4_1_ = 0x80;
    }
    *(Byte **)(sd_local[6].Size + (ulong)folderIndex * 8) = digestsDefs;
    pBVar5 = sd_local[8].Data + (ulong)folderIndex * 4;
    pBVar5[0] = '\0';
    pBVar5[1] = '\0';
    pBVar5[2] = '\0';
    pBVar5[3] = '\0';
    if ((emptyFiles == (Byte *)0x0) ||
       (((uint)emptyFiles[folderIndex >> 3] & 0x80 >> ((byte)folderIndex & 7)) == 0)) {
LAB_0011fc04:
      if (local_1b8 == 0) {
        while( true ) {
          if (*(uint *)((long)&sd_local->Data + 4) <= numSubStreams) {
            return 0x10;
          }
          *(UInt32 *)(sd_local[0xb].Size + (ulong)numSubStreams * 4) = folderIndex;
          unpackPos._4_4_ = 1;
          if (ssi._0_8_ != 0) {
            SVar2 = SzReadNumber32((CSzData *)&ssi,(UInt32 *)((long)&unpackPos + 4));
            if (SVar2 != 0) {
              return SVar2;
            }
            folderUnpackSize._0_4_ = 0;
          }
          local_1b8 = unpackPos._4_4_;
          if (unpackPos._4_4_ != 0) break;
          folderUnpackSize_1 = SzAr_GetFolderUnpackSize((CSzAr *)sd_local,numSubStreams);
          digestsDefs = (Byte *)(folderUnpackSize_1 + (long)digestsDefs);
          if (digestsDefs < folderUnpackSize_1) {
            return 0x10;
          }
          numSubStreams = numSubStreams + 1;
        }
      }
      *(UInt32 *)(sd_local[0xc].Data + (ulong)folderIndex * 4) = numSubStreams;
      if ((emptyFiles == (Byte *)0x0) ||
         (((uint)emptyFiles[folderIndex >> 3] & 0x80 >> ((byte)folderIndex & 7)) == 0)) {
        local_1b8 = local_1b8 + -1;
        if (local_1b8 == 0) {
          startFolderUnpackPos = SzAr_GetFolderUnpackSize((CSzAr *)sd_local,numSubStreams);
          v = *(UInt64 *)
               (sd_local[6].Size +
               (ulong)*(uint *)(sd_local[0xb].Size + (ulong)numSubStreams * 4) * 8);
          if (startFolderUnpackPos < digestsDefs + -v) {
            return 0x10;
          }
          digestsDefs = (Byte *)(startFolderUnpackPos + v);
          if (digestsDefs < startFolderUnpackPos) {
            return 0x10;
          }
          if (((unpackPos._4_4_ == 1) && (sd_local[1].Data != (Byte *)0x0)) &&
             (((uint)sd_local[1].Data[folderIndex >> 3] & 0x80 >> ((byte)folderIndex & 7)) != 0)) {
            *(undefined4 *)(sd_local[8].Data + (ulong)folderIndex * 4) =
                 *(undefined4 *)(sd_local[1].Size + (ulong)numSubStreams * 4);
            numBytes._5_1_ = numBytes._5_1_ | numBytes._4_1_;
          }
          else if ((numBytes._7_1_ != '\0') ||
                  ((digestsVals != (Byte *)0x0 &&
                   (((uint)digestsVals[(uint)__result___21 >> 3] & 0x80 >> ((byte)__result___21 & 7)
                    ) != 0)))) {
            *(uint *)(sd_local[8].Data + (ulong)folderIndex * 4) =
                 CONCAT13(_digestIndex[(ulong)_mask * 4 + 3],
                          CONCAT12(_digestIndex[(ulong)_mask * 4 + 2],
                                   CONCAT11(_digestIndex[(ulong)_mask * 4 + 1],
                                            _digestIndex[(ulong)_mask * 4])));
            _mask = _mask + 1;
            numBytes._5_1_ = numBytes._5_1_ | numBytes._4_1_;
          }
          numSubStreams = numSubStreams + 1;
        }
        else {
          SVar2 = ReadNumber((CSzData *)&ssi.sdNumSubStreams.Size,(UInt64 *)&byteIndex_1);
          if (SVar2 != 0) {
            return SVar2;
          }
          digestsDefs = _byteIndex_1 + (long)digestsDefs;
          if (digestsDefs < _byteIndex_1) {
            return 0x10;
          }
          if ((numBytes._7_1_ != '\0') ||
             ((digestsVals != (Byte *)0x0 &&
              (((uint)digestsVals[(uint)__result___21 >> 3] & 0x80 >> ((byte)__result___21 & 7)) !=
               0)))) {
            *(uint *)(sd_local[8].Data + (ulong)folderIndex * 4) =
                 CONCAT13(_digestIndex[(ulong)_mask * 4 + 3],
                          CONCAT12(_digestIndex[(ulong)_mask * 4 + 2],
                                   CONCAT11(_digestIndex[(ulong)_mask * 4 + 1],
                                            _digestIndex[(ulong)_mask * 4])));
            _mask = _mask + 1;
            numBytes._5_1_ = numBytes._5_1_ | numBytes._4_1_;
          }
        }
      }
    }
    else {
      if (pBStack_118 == (Byte *)0x0) {
        numBytes._6_1_ = numBytes._6_1_ | numBytes._4_1_;
      }
      else {
        if (((uint)pBStack_118[remSubStreams >> 3] & 0x80 >> ((byte)remSubStreams & 7)) == 0) {
          numBytes._6_1_ = numBytes._6_1_ | numBytes._4_1_;
        }
        remSubStreams = remSubStreams + 1;
      }
      if (local_1b8 != 0) goto LAB_0011fc04;
      pBVar5 = sd_local[0xc].Data + (ulong)folderIndex * 4;
      pBVar5[0] = 0xff;
      pBVar5[1] = 0xff;
      pBVar5[2] = 0xff;
      pBVar5[3] = 0xff;
    }
    folderIndex = folderIndex + 1;
    numBytes._4_1_ = (byte)((int)(uint)numBytes._4_1_ >> 1);
  } while( true );
}

Assistant:

static SRes SzReadHeader2(
    CSzArEx *p,   /* allocMain */
    CSzData *sd,
    ILookInStream *inStream,
    CBuf *tempBufs, UInt32 *numTempBufs,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp
    )
{
  CSubStreamInfo ssi;

{
  UInt64 type;
  
  SzData_Clear(&ssi.sdSizes);
  SzData_Clear(&ssi.sdCRCs);
  SzData_Clear(&ssi.sdNumSubStreams);

  ssi.NumSubDigests = 0;
  ssi.NumTotalSubStreams = 0;

  RINOK(ReadID(sd, &type));

  if (type == k7zIdArchiveProperties)
  {
    for (;;)
    {
      UInt64 type2;
      RINOK(ReadID(sd, &type2));
      if (type2 == k7zIdEnd)
        break;
      RINOK(SkipData(sd));
    }
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdAdditionalStreamsInfo)
  {
    CSzAr tempAr;
    SRes res;
    
    SzAr_Init(&tempAr);
    res = SzReadAndDecodePackedStreams(inStream, sd, tempBufs, NUM_ADDITIONAL_STREAMS_MAX,
        p->startPosAfterHeader, &tempAr, allocTemp);
    *numTempBufs = tempAr.NumFolders;
    SzAr_Free(&tempAr, allocTemp);
    
    if (res != SZ_OK)
      return res;
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdMainStreamsInfo)
  {
    RINOK(SzReadStreamsInfo(&p->db, sd, (UInt32)1 << 30, tempBufs, *numTempBufs,
        &p->dataPos, &ssi, allocMain));
    p->dataPos += p->startPosAfterHeader;
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdEnd)
  {
    return SZ_OK;
  }

  if (type != k7zIdFilesInfo)
    return SZ_ERROR_ARCHIVE;
}

{
  UInt32 numFiles = 0;
  UInt32 numEmptyStreams = 0;
  const Byte *emptyStreams = NULL;
  const Byte *emptyFiles = NULL;
  
  RINOK(SzReadNumber32(sd, &numFiles));
  p->NumFiles = numFiles;

  for (;;)
  {
    UInt64 type;
    UInt64 size;
    RINOK(ReadID(sd, &type));
    if (type == k7zIdEnd)
      break;
    RINOK(ReadNumber(sd, &size));
    if (size > sd->Size)
      return SZ_ERROR_ARCHIVE;
    
    if (type >= ((UInt32)1 << 8))
    {
      SKIP_DATA(sd, size);
    }
    else switch ((unsigned)type)
    {
      case k7zIdName:
      {
        size_t namesSize;
        const Byte *namesData;
        Byte external;

        SZ_READ_BYTE(external);
        if (external == 0)
        {
          namesSize = (size_t)size - 1;
          namesData = sd->Data;
        }
        else
        {
          UInt32 index;
          RINOK(SzReadNumber32(sd, &index));
          if (index >= *numTempBufs)
            return SZ_ERROR_ARCHIVE;
          namesData = (tempBufs)[index].data;
          namesSize = (tempBufs)[index].size;
        }

        if ((namesSize & 1) != 0)
          return SZ_ERROR_ARCHIVE;
        MY_ALLOC(size_t, p->FileNameOffsets, numFiles + 1, allocMain);
        MY_ALLOC_ZE_AND_CPY(p->FileNames, namesSize, namesData, allocMain);
        RINOK(SzReadFileNames(p->FileNames, namesSize, numFiles, p->FileNameOffsets))
        if (external == 0)
        {
          SKIP_DATA(sd, namesSize);
        }
        break;
      }
      case k7zIdEmptyStream:
      {
        RINOK(RememberBitVector(sd, numFiles, &emptyStreams));
        numEmptyStreams = CountDefinedBits(emptyStreams, numFiles);
        emptyFiles = NULL;
        break;
      }
      case k7zIdEmptyFile:
      {
        RINOK(RememberBitVector(sd, numEmptyStreams, &emptyFiles));
        break;
      }
      case k7zIdWinAttrib:
      {
        Byte external;
        CSzData sdSwitch;
        CSzData *sdPtr;
        SzBitUi32s_Free(&p->Attribs, allocMain);
        RINOK(ReadBitVector(sd, numFiles, &p->Attribs.Defs, allocMain));

        SZ_READ_BYTE(external);
        if (external == 0)
          sdPtr = sd;
        else
        {
          UInt32 index;
          RINOK(SzReadNumber32(sd, &index));
          if (index >= *numTempBufs)
            return SZ_ERROR_ARCHIVE;
          sdSwitch.Data = (tempBufs)[index].data;
          sdSwitch.Size = (tempBufs)[index].size;
          sdPtr = &sdSwitch;
        }
        RINOK(ReadUi32s(sdPtr, numFiles, &p->Attribs, allocMain));
        break;
      }
      /*
      case k7zParent:
      {
        SzBitUi32s_Free(&p->Parents, allocMain);
        RINOK(ReadBitVector(sd, numFiles, &p->Parents.Defs, allocMain));
        RINOK(SzReadSwitch(sd));
        RINOK(ReadUi32s(sd, numFiles, &p->Parents, allocMain));
        break;
      }
      */
      case k7zIdMTime: RINOK(ReadTime(&p->MTime, numFiles, sd, tempBufs, *numTempBufs, allocMain)); break;
      case k7zIdCTime: RINOK(ReadTime(&p->CTime, numFiles, sd, tempBufs, *numTempBufs, allocMain)); break;
      default:
      {
        SKIP_DATA(sd, size);
      }
    }
  }

  if (numFiles - numEmptyStreams != ssi.NumTotalSubStreams)
    return SZ_ERROR_ARCHIVE;

  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == k7zIdEnd)
      break;
    RINOK(SkipData(sd));
  }

  {
    UInt32 i;
    UInt32 emptyFileIndex = 0;
    UInt32 folderIndex = 0;
    UInt32 remSubStreams = 0;
    UInt32 numSubStreams = 0;
    UInt64 unpackPos = 0;
    const Byte *digestsDefs = NULL;
    const Byte *digestsVals = NULL;
    UInt32 digestsValsIndex = 0;
    UInt32 digestIndex;
    Byte allDigestsDefined = 0;
    Byte isDirMask = 0;
    Byte crcMask = 0;
    Byte mask = 0x80;
    
    MY_ALLOC(UInt32, p->FolderToFile, p->db.NumFolders + 1, allocMain);
    MY_ALLOC_ZE(UInt32, p->FileToFolder, p->NumFiles, allocMain);
    MY_ALLOC(UInt64, p->UnpackPositions, p->NumFiles + 1, allocMain);
    MY_ALLOC_ZE(Byte, p->IsDirs, (p->NumFiles + 7) >> 3, allocMain);

    RINOK(SzBitUi32s_Alloc(&p->CRCs, p->NumFiles, allocMain));

    if (ssi.sdCRCs.Size != 0)
    {
      SZ_READ_BYTE_SD(&ssi.sdCRCs, allDigestsDefined);
      if (allDigestsDefined)
        digestsVals = ssi.sdCRCs.Data;
      else
      {
        size_t numBytes = (ssi.NumSubDigests + 7) >> 3;
        digestsDefs = ssi.sdCRCs.Data;
        digestsVals = digestsDefs + numBytes;
      }
    }

    digestIndex = 0;
    
    for (i = 0; i < numFiles; i++, mask >>= 1)
    {
      if (mask == 0)
      {
        UInt32 byteIndex = (i - 1) >> 3;
        p->IsDirs[byteIndex] = isDirMask;
        p->CRCs.Defs[byteIndex] = crcMask;
        isDirMask = 0;
        crcMask = 0;
        mask = 0x80;
      }

      p->UnpackPositions[i] = unpackPos;
      p->CRCs.Vals[i] = 0;
      
      if (emptyStreams && SzBitArray_Check(emptyStreams, i))
      {
        if (emptyFiles)
        {
          if (!SzBitArray_Check(emptyFiles, emptyFileIndex))
            isDirMask |= mask;
          emptyFileIndex++;
        }
        else
          isDirMask |= mask;
        if (remSubStreams == 0)
        {
          p->FileToFolder[i] = (UInt32)-1;
          continue;
        }
      }
      
      if (remSubStreams == 0)
      {
        for (;;)
        {
          if (folderIndex >= p->db.NumFolders)
            return SZ_ERROR_ARCHIVE;
          p->FolderToFile[folderIndex] = i;
          numSubStreams = 1;
          if (ssi.sdNumSubStreams.Data)
          {
            RINOK(SzReadNumber32(&ssi.sdNumSubStreams, &numSubStreams));
          }
          remSubStreams = numSubStreams;
          if (numSubStreams != 0)
            break;
          {
            UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
            unpackPos += folderUnpackSize;
            if (unpackPos < folderUnpackSize)
              return SZ_ERROR_ARCHIVE;
          }

          folderIndex++;
        }
      }
      
      p->FileToFolder[i] = folderIndex;
      
      if (emptyStreams && SzBitArray_Check(emptyStreams, i))
        continue;
      
      if (--remSubStreams == 0)
      {
        UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
        UInt64 startFolderUnpackPos = p->UnpackPositions[p->FolderToFile[folderIndex]];
        if (folderUnpackSize < unpackPos - startFolderUnpackPos)
          return SZ_ERROR_ARCHIVE;
        unpackPos = startFolderUnpackPos + folderUnpackSize;
        if (unpackPos < folderUnpackSize)
          return SZ_ERROR_ARCHIVE;

        if (numSubStreams == 1 && SzBitWithVals_Check(&p->db.FolderCRCs, i))
        {
          p->CRCs.Vals[i] = p->db.FolderCRCs.Vals[folderIndex];
          crcMask |= mask;
        }
        else if (allDigestsDefined || (digestsDefs && SzBitArray_Check(digestsDefs, digestIndex)))
        {
          p->CRCs.Vals[i] = GetUi32(digestsVals + (size_t)digestsValsIndex * 4);
          digestsValsIndex++;
          crcMask |= mask;
        }
        
        folderIndex++;
      }
      else
      {
        UInt64 v;
        RINOK(ReadNumber(&ssi.sdSizes, &v));
        unpackPos += v;
        if (unpackPos < v)
          return SZ_ERROR_ARCHIVE;
        if (allDigestsDefined || (digestsDefs && SzBitArray_Check(digestsDefs, digestIndex)))
        {
          p->CRCs.Vals[i] = GetUi32(digestsVals + (size_t)digestsValsIndex * 4);
          digestsValsIndex++;
          crcMask |= mask;
        }
      }
    }

    if (mask != 0x80)
    {
      UInt32 byteIndex = (i - 1) >> 3;
      p->IsDirs[byteIndex] = isDirMask;
      p->CRCs.Defs[byteIndex] = crcMask;
    }
    
    p->UnpackPositions[i] = unpackPos;

    if (remSubStreams != 0)
      return SZ_ERROR_ARCHIVE;

    for (;;)
    {
      p->FolderToFile[folderIndex] = i;
      if (folderIndex >= p->db.NumFolders)
        break;
      if (!ssi.sdNumSubStreams.Data)
        return SZ_ERROR_ARCHIVE;
      RINOK(SzReadNumber32(&ssi.sdNumSubStreams, &numSubStreams));
      if (numSubStreams != 0)
        return SZ_ERROR_ARCHIVE;
      /*
      {
        UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
        unpackPos += folderUnpackSize;
        if (unpackPos < folderUnpackSize)
          return SZ_ERROR_ARCHIVE;
      }
      */
      folderIndex++;
    }

    if (ssi.sdNumSubStreams.Data && ssi.sdNumSubStreams.Size != 0)
      return SZ_ERROR_ARCHIVE;
  }
}
  return SZ_OK;
}